

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TopKLayerParams::SerializeWithCachedSizes
          (TopKLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->k_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->k_,output);
  }
  if (this->usebottomk_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
    return;
  }
  return;
}

Assistant:

void TopKLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TopKLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // uint64 K = 2;
  if (this->k() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->k(), output);
  }

  // bool useBottomK = 3;
  if (this->usebottomk() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->usebottomk(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TopKLayerParams)
}